

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq_test.c
# Opt level: O2

void sender(char *mq_name)

{
  uint tester_mq;
  __pid_t _Var1;
  char *mq_name_00;
  _Bool local_19 [8];
  _Bool err;
  
  local_19[0] = false;
  test_log("SENDER: creating mq...");
  mq_name_00 = (char *)0x0;
  tester_mq = tester_mq_start(false,mq_name,local_19);
  if (local_19[0] != true) {
    test_log("SENDER: created mq");
    test_log("SENDER: sending COMPLETED...");
    mq_name_00 = (char *)(ulong)tester_mq;
    tester_mq_send(tester_mq,"completed",true,0,false,false,local_19);
    if (local_19[0] != true) {
      test_log("SENDER: sent COMPLETED");
      sleep(3);
      test_log("SENDER: sending IGNORED...");
      mq_name_00 = (char *)(ulong)tester_mq;
      tester_mq_send(tester_mq,"ignored",false,0,true,false,local_19);
      if (local_19[0] != true) {
        test_log("SENDER: sent IGNORED");
        sleep(3);
        test_log("SENDER: sending ACCEPTED...");
        mq_name_00 = (char *)(ulong)tester_mq;
        tester_mq_send(tester_mq,"accepted",false,0,false,true,local_19);
        if (local_19[0] != true) {
          test_log("SENDER: sent ACCEPTED");
          sleep(3);
          test_log("SENDER: finishing...");
          mq_name_00 = (char *)0x0;
          tester_mq_finish(false,tester_mq,(char *)0x0,local_19);
          if (local_19[0] != true) {
            test_log("SENDER: finish");
            return;
          }
        }
      }
    }
  }
  err_sender();
  _Var1 = fork();
  if (_Var1 != 0) {
    if (_Var1 != -1) {
      return;
    }
    test_log("Error in fork");
    exit(-1);
  }
  sleep(10);
  sender(mq_name_00);
  exit(0);
}

Assistant:

void sender(const char * mq_name) {
    bool err = false;

    test_log("SENDER: creating mq...");
    mqd_t tester_mq = tester_mq_start(false, mq_name, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: created mq");

    test_log("SENDER: sending COMPLETED...");
    tester_mq_send(tester_mq, "completed", true, 0, false, false, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent COMPLETED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: sending IGNORED...");
    tester_mq_send(tester_mq, "ignored", false, 0, true, false, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent IGNORED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: sending ACCEPTED...");
    tester_mq_send(tester_mq, "accepted", false, 0, false, true, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent ACCEPTED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: finishing...");
    tester_mq_finish(false, tester_mq, NULL, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: finish");
}